

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
UA_Session_deleteSubscription(UA_Server *server,UA_Session *session,UA_UInt32 subscriptionID)

{
  UA_Subscription *pUVar1;
  UA_Subscription **ppUVar2;
  UA_Subscription *subscription;
  
  subscription = (UA_Subscription *)&session->serverSubscriptions;
  do {
    subscription = (subscription->listEntry).le_next;
    if (subscription == (UA_Subscription *)0x0) {
      return 0x80280000;
    }
  } while (subscription->subscriptionID != subscriptionID);
  pUVar1 = (subscription->listEntry).le_next;
  ppUVar2 = (subscription->listEntry).le_prev;
  if (pUVar1 != (UA_Subscription *)0x0) {
    (pUVar1->listEntry).le_prev = ppUVar2;
  }
  *ppUVar2 = pUVar1;
  UA_Subscription_deleteMembers(subscription,server);
  free(subscription);
  return 0;
}

Assistant:

UA_StatusCode
UA_Session_deleteSubscription(UA_Server *server, UA_Session *session,
                              UA_UInt32 subscriptionID) {
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, subscriptionID);
    if(!sub)
        return UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
    LIST_REMOVE(sub, listEntry);
    UA_Subscription_deleteMembers(sub, server);
    UA_free(sub);
    return UA_STATUSCODE_GOOD;
}